

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::Matchers::IsNaNMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,IsNaNMatcher *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  *(undefined4 *)&__return_storage_ptr__->field_2 = 0x4e207369;
  *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 4) = 0x4e61;
  __return_storage_ptr__->_M_string_length = 6;
  (__return_storage_ptr__->field_2)._M_local_buf[6] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string IsNaNMatcher::describe() const {
    using namespace std::string_literals;
    return "is NaN"s;
}